

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O3

void __thiscall
avro::detail::BufferImpl::copyData
          (BufferImpl *this,BufferImpl *dest,const_iterator *iter,size_type offset,size_type bytes)

{
  data_type **ppdVar1;
  _Map_pointer ppCVar2;
  Chunk *pCVar3;
  data_type *pdVar4;
  _Map_pointer ppCVar5;
  _Elt_pointer pCVar6;
  _Elt_pointer pCVar7;
  _Elt_pointer pCVar8;
  _Elt_pointer __x;
  data_type *pdVar9;
  data_type *pdVar10;
  
  if (bytes == 0) {
    pCVar6 = (dest->readChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    pCVar7 = (dest->readChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    pdVar10 = (data_type *)0x0;
  }
  else {
    __x = iter->_M_cur;
    pdVar10 = (data_type *)0x0;
    do {
      std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::push_back
                (&dest->readChunks_,__x);
      pCVar6 = (dest->readChunks_).
               super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      pCVar7 = (dest->readChunks_).
               super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first;
      if (pCVar6 == pCVar7) {
        ppCVar2 = (dest->readChunks_).
                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        ppdVar1 = &ppCVar2[-1][8].readPos_;
        *ppdVar1 = *ppdVar1 + offset;
        pCVar3 = ppCVar2[-1];
        pdVar9 = pCVar3[8].readPos_;
        pCVar8 = pCVar3 + 9;
      }
      else {
        pdVar9 = pCVar6[-1].readPos_ + offset;
        pCVar6[-1].readPos_ = pdVar9;
        pCVar8 = pCVar6;
      }
      pdVar4 = pCVar8[-1].writePos_;
      __x = iter->_M_cur + 1;
      iter->_M_cur = __x;
      if (__x == iter->_M_last) {
        ppCVar5 = iter->_M_node;
        iter->_M_node = ppCVar5 + 1;
        __x = ppCVar5[1];
        iter->_M_first = __x;
        iter->_M_last = __x + 9;
        iter->_M_cur = __x;
      }
      pdVar10 = pdVar4 + ((long)pdVar10 - (long)pdVar9);
      offset = 0;
    } while (pdVar10 < bytes);
  }
  if (pCVar6 == pCVar7) {
    pCVar6 = (dest->readChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  pCVar6[-1].writePos_ = pCVar6[-1].writePos_ + (bytes - (long)pdVar10);
  dest->size_ = dest->size_ + bytes;
  return;
}

Assistant:

void copyData(BufferImpl &dest, 
                  ChunkList::const_iterator iter,
                  size_type offset, 
                  size_type bytes) const
    {
        // now we are positioned to start the copying, copy as many
        // chunks as we need, the first chunk may have a non-zero offset 
        // if the data to copy is not at the start of the chunk 
        size_type copied = 0;
        while(copied < bytes) {

            dest.readChunks_.push_back(*iter);

            // offset only applies in the first chunk, 
            // all subsequent chunks are copied from the start
            dest.readChunks_.back().truncateFront(offset);
            offset = 0;

            copied += dest.readChunks_.back().dataSize(); 
            ++iter;
        }

        // if the last chunk copied has more bytes than we need, truncate it
        size_type excess = copied - bytes;
        dest.readChunks_.back().truncateBack(excess);

        dest.size_ += bytes;
    }